

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O1

bool __thiscall
cmCMakeHostSystemInformationCommand::GetValue
          (cmCMakeHostSystemInformationCommand *this,SystemInformation *info,string *key,
          string *value)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t value_00;
  char *pcVar5;
  char *pcVar6;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  pcVar6 = "NUMBER_OF_LOGICAL_CORES";
  iVar2 = std::__cxx11::string::compare((char *)key);
  if (iVar2 == 0) {
    uVar3 = cmsys::SystemInformation::GetNumberOfLogicalCPU(info);
LAB_002caa11:
    value_00 = (size_t)uVar3;
LAB_002caa1b:
    ValueToString_abi_cxx11_(&local_60,(cmCMakeHostSystemInformationCommand *)pcVar6,value_00);
LAB_002caa20:
    std::__cxx11::string::operator=((string *)value,(string *)&local_60);
  }
  else {
    pcVar6 = "NUMBER_OF_PHYSICAL_CORES";
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      uVar3 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(info);
      goto LAB_002caa11;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar5 = cmsys::SystemInformation::GetHostname(info);
      pcVar6 = "";
      if (pcVar5 != (char *)0x0) {
        pcVar6 = pcVar5;
      }
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      sVar4 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,pcVar6,pcVar6 + sVar4);
      std::__cxx11::string::operator=((string *)value,(string *)&local_60);
      local_40.field_2._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
      local_40._M_dataplus._M_p = local_60._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return true;
      }
      goto LAB_002caa3d;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_(&local_40,info);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,local_40._M_dataplus._M_p,
                 local_40._M_dataplus._M_p + local_40._M_string_length);
      std::__cxx11::string::operator=((string *)value,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return true;
      }
      goto LAB_002caa3d;
    }
    pcVar6 = "TOTAL_VIRTUAL_MEMORY";
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      value_00 = cmsys::SystemInformation::GetTotalVirtualMemory(info);
      goto LAB_002caa1b;
    }
    pcVar6 = "AVAILABLE_VIRTUAL_MEMORY";
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      value_00 = cmsys::SystemInformation::GetAvailableVirtualMemory(info);
      goto LAB_002caa1b;
    }
    pcVar6 = "TOTAL_PHYSICAL_MEMORY";
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      value_00 = cmsys::SystemInformation::GetTotalPhysicalMemory(info);
      goto LAB_002caa1b;
    }
    pcVar6 = "AVAILABLE_PHYSICAL_MEMORY";
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      value_00 = cmsys::SystemInformation::GetAvailablePhysicalMemory(info);
      goto LAB_002caa1b;
    }
    pcVar6 = "IS_64BIT";
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      bVar1 = cmsys::SystemInformation::Is64Bits(info);
LAB_002caba6:
      value_00 = (size_t)bVar1;
      goto LAB_002caa1b;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x800000;
LAB_002cab9e:
      bVar1 = cmsys::SystemInformation::DoesCPUSupportFeature(info,(long)pcVar6);
      goto LAB_002caba6;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x1;
      goto LAB_002cab9e;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x2;
      goto LAB_002cab9e;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x4;
      goto LAB_002cab9e;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x8;
      goto LAB_002cab9e;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x800;
      goto LAB_002cab9e;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x1000;
      goto LAB_002cab9e;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x10;
      goto LAB_002cab9e;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x20;
      goto LAB_002cab9e;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x40;
      goto LAB_002cab9e;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar6 = (char *)0x200;
      goto LAB_002cab9e;
    }
    pcVar6 = "PROCESSOR_NAME";
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 == 0) {
      pcVar5 = cmsys::SystemInformation::GetExtendedProcessorName(info);
LAB_002cac0b:
      ValueToString_abi_cxx11_(&local_60,(cmCMakeHostSystemInformationCommand *)pcVar6,pcVar5);
      goto LAB_002caa20;
    }
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 != 0) {
      pcVar6 = "PROCESSOR_SERIAL_NUMBER";
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        pcVar5 = cmsys::SystemInformation::GetProcessorSerialNumber(info);
      }
      else {
        pcVar6 = "OS_NAME";
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          pcVar5 = cmsys::SystemInformation::GetOSName(info);
        }
        else {
          pcVar6 = "OS_RELEASE";
          iVar2 = std::__cxx11::string::compare((char *)key);
          if (iVar2 == 0) {
            pcVar5 = cmsys::SystemInformation::GetOSRelease(info);
          }
          else {
            pcVar6 = "OS_VERSION";
            iVar2 = std::__cxx11::string::compare((char *)key);
            if (iVar2 == 0) {
              pcVar5 = cmsys::SystemInformation::GetOSVersion(info);
            }
            else {
              pcVar6 = "OS_PLATFORM";
              iVar2 = std::__cxx11::string::compare((char *)key);
              if (iVar2 != 0) {
                std::operator+(&local_60,"does not recognize <key> ",key);
                cmCommand::SetError(&this->super_cmCommand,&local_60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_60._M_dataplus._M_p != &local_60.field_2) {
                  operator_delete(local_60._M_dataplus._M_p,
                                  local_60.field_2._M_allocated_capacity + 1);
                }
                return false;
              }
              pcVar5 = cmsys::SystemInformation::GetOSPlatform(info);
            }
          }
        }
      }
      goto LAB_002cac0b;
    }
    cmsys::SystemInformation::GetCPUDescription_abi_cxx11_(&local_60,info);
    std::__cxx11::string::operator=((string *)value,(string *)&local_60);
  }
  local_40.field_2._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
  local_40._M_dataplus._M_p = local_60._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == &local_60.field_2) {
    return true;
  }
LAB_002caa3d:
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  return true;
}

Assistant:

bool cmCMakeHostSystemInformationCommand::GetValue(
  cmsys::SystemInformation& info, std::string const& key, std::string& value)
{
  if (key == "NUMBER_OF_LOGICAL_CORES") {
    value = this->ValueToString(info.GetNumberOfLogicalCPU());
  } else if (key == "NUMBER_OF_PHYSICAL_CORES") {
    value = this->ValueToString(info.GetNumberOfPhysicalCPU());
  } else if (key == "HOSTNAME") {
    value = this->ValueToString(info.GetHostname());
  } else if (key == "FQDN") {
    value = this->ValueToString(info.GetFullyQualifiedDomainName());
  } else if (key == "TOTAL_VIRTUAL_MEMORY") {
    value = this->ValueToString(info.GetTotalVirtualMemory());
  } else if (key == "AVAILABLE_VIRTUAL_MEMORY") {
    value = this->ValueToString(info.GetAvailableVirtualMemory());
  } else if (key == "TOTAL_PHYSICAL_MEMORY") {
    value = this->ValueToString(info.GetTotalPhysicalMemory());
  } else if (key == "AVAILABLE_PHYSICAL_MEMORY") {
    value = this->ValueToString(info.GetAvailablePhysicalMemory());
  } else if (key == "IS_64BIT") {
    value = this->ValueToString(info.Is64Bits());
  } else if (key == "HAS_FPU") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_FPU));
  } else if (key == "HAS_MMX") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_MMX));
  } else if (key == "HAS_MMX_PLUS") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_MMX_PLUS));
  } else if (key == "HAS_SSE") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_SSE));
  } else if (key == "HAS_SSE2") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_SSE2));
  } else if (key == "HAS_SSE_FP") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_SSE_FP));
  } else if (key == "HAS_SSE_MMX") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_SSE_MMX));
  } else if (key == "HAS_AMD_3DNOW") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_AMD_3DNOW));
  } else if (key == "HAS_AMD_3DNOW_PLUS") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_AMD_3DNOW_PLUS));
  } else if (key == "HAS_IA64") {
    value = this->ValueToString(
      info.DoesCPUSupportFeature(cmsys::SystemInformation::CPU_FEATURE_IA64));
  } else if (key == "HAS_SERIAL_NUMBER") {
    value = this->ValueToString(info.DoesCPUSupportFeature(
      cmsys::SystemInformation::CPU_FEATURE_SERIALNUMBER));
  } else if (key == "PROCESSOR_NAME") {
    value = this->ValueToString(info.GetExtendedProcessorName());
  } else if (key == "PROCESSOR_DESCRIPTION") {
    value = info.GetCPUDescription();
  } else if (key == "PROCESSOR_SERIAL_NUMBER") {
    value = this->ValueToString(info.GetProcessorSerialNumber());
  } else if (key == "OS_NAME") {
    value = this->ValueToString(info.GetOSName());
  } else if (key == "OS_RELEASE") {
    value = this->ValueToString(info.GetOSRelease());
  } else if (key == "OS_VERSION") {
    value = this->ValueToString(info.GetOSVersion());
  } else if (key == "OS_PLATFORM") {
    value = this->ValueToString(info.GetOSPlatform());
#ifdef HAVE_VS_SETUP_HELPER
  } else if (key == "VS_15_DIR") {
    cmVSSetupAPIHelper vsSetupAPIHelper;
    if (vsSetupAPIHelper.GetVSInstanceInfo(value)) {
      cmSystemTools::ConvertToUnixSlashes(value);
    }
#endif
  } else {
    std::string e = "does not recognize <key> " + key;
    this->SetError(e);
    return false;
  }

  return true;
}